

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QTimeZone __thiscall QDateTime::Data::timeZone(Data *this)

{
  bool bVar1;
  TimeSpec TVar2;
  Data in_RDI;
  undefined4 in_stack_ffffffffffffffc8;
  Initialization in_stack_ffffffffffffffcc;
  Data this_00;
  
  this_00 = in_RDI;
  TVar2 = getSpec((QDateTimeData *)in_RDI.d);
  switch(TVar2) {
  case LocalTime:
    QTimeZone::QTimeZone((QTimeZone *)in_RDI.d,in_stack_ffffffffffffffcc);
    break;
  case UTC:
    QTimeZone::QTimeZone((QTimeZone *)in_RDI.d,in_stack_ffffffffffffffcc);
    break;
  case OffsetFromUTC:
    QTimeZone::fromSecondsAheadOfUtc(0);
    break;
  case TimeZone:
    bVar1 = QTimeZone::isValid((QTimeZone *)this_00.d);
    if (bVar1) {
      QTimeZone::QTimeZone
                ((QTimeZone *)in_RDI.d,
                 (QTimeZone *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      return (QTimeZone)this_00.d;
    }
  default:
    QTimeZone::QTimeZone((QTimeZone *)0x56dbf1);
  }
  return (QTimeZone)this_00;
}

Assistant:

QTimeZone QDateTime::Data::timeZone() const
{
    switch (getSpec(*this)) {
    case Qt::UTC:
        return QTimeZone::UTC;
    case Qt::OffsetFromUTC:
        return QTimeZone::fromSecondsAheadOfUtc(d->m_offsetFromUtc);
    case Qt::TimeZone:
#if QT_CONFIG(timezone)
        if (d->m_timeZone.isValid())
            return d->m_timeZone;
#endif
        break;
    case Qt::LocalTime:
        return QTimeZone::LocalTime;
    }
    return QTimeZone();
}